

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O2

int BN_is_bit_set(BIGNUM *a,int n)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((-1 < n) && ((int)((uint)n >> 6) < a->top)) {
    uVar1 = (uint)((a->d[(uint)n >> 6] >> ((ulong)(uint)n & 0x3f) & 1) != 0);
  }
  return uVar1;
}

Assistant:

int BN_is_bit_set(const BIGNUM *a, int n)
{
    int i, j;

    bn_check_top(a);
    if (n < 0)
        return 0;
    i = n / BN_BITS2;
    j = n % BN_BITS2;
    if (a->top <= i)
        return 0;
    return (int)(((a->d[i]) >> j) & ((BN_ULONG)1));
}